

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O0

DdNode * cuddAddCmplRecur(DdManager *dd,DdNode *f)

{
  DdNode *f_00;
  DdManager *T;
  DdManager *E;
  DdManager *local_60;
  DdNode *e;
  DdNode *t;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)dd->zero;
  if (f->index == 0x7fffffff) {
    if ((DdManager *)f == dd_local) {
      dd_local = (DdManager *)dd->one;
    }
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1(dd,Cudd_addCmpl,f);
    if (dd_local == (DdManager *)0x0) {
      f_00 = (f->type).kids.E;
      T = (DdManager *)cuddAddCmplRecur(dd,(f->type).kids.T);
      if (T == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
        E = (DdManager *)cuddAddCmplRecur(dd,f_00);
        if (E == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
          local_60 = T;
          if (T != E) {
            local_60 = (DdManager *)cuddUniqueInter(dd,f->index,(DdNode *)T,(DdNode *)E);
          }
          if (local_60 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)T);
            Cudd_RecursiveDeref(dd,(DdNode *)E);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert1(dd,Cudd_addCmpl,f,&local_60->sentinel);
            dd_local = local_60;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddCmplRecur(
  DdManager * dd,
  DdNode * f)
{
    DdNode *one,*zero;
    DdNode *r,*Fv,*Fnv,*t,*e;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd); 

    if (cuddIsConstant(f)) {
        if (f == zero) {
            return(one);
        } else {
            return(zero);
        }
    }
    r = cuddCacheLookup1(dd,Cudd_addCmpl,f);
    if (r != NULL) {
        return(r);
    }
    Fv = cuddT(f);
    Fnv = cuddE(f);
    t = cuddAddCmplRecur(dd,Fv);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = cuddAddCmplRecur(dd,Fnv);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);
    r = (t == e) ? t : cuddUniqueInter(dd,(int)f->index,t,e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);
    cuddCacheInsert1(dd,Cudd_addCmpl,f,r);
    return(r);

}